

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O3

void __thiscall
tvm::runtime::WorkspacePool::Pool::Release(Pool *this,TVMContext ctx,DeviceAPI *device)

{
  ostream *poVar1;
  pointer pEVar2;
  pointer pEVar3;
  ulong uVar4;
  long lVar5;
  LogCheckError _check_err;
  LogCheckError local_1c0;
  int local_1b4;
  LogMessageFatal local_1b0;
  
  local_1b0._0_8_ =
       (long)(this->allocated_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->allocated_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_1b4 = 1;
  dmlc::LogCheck_EQ<unsigned_long,int>((dmlc *)&local_1c0,(unsigned_long *)&local_1b0,&local_1b4);
  if (local_1c0.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/workspace_pool.cc"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"allocated_.size() == 1",0x16);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1b0,((local_1c0.str)->_M_dataplus)._M_p,
                        (local_1c0.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  dmlc::LogCheckError::~LogCheckError(&local_1c0);
  pEVar2 = (this->free_list_).
           super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->free_list_).
           super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0x10 < (ulong)((long)pEVar3 - (long)pEVar2)) {
    uVar4 = 1;
    lVar5 = 0x10;
    do {
      (*device->_vptr_DeviceAPI[5])(device,ctx,*(undefined8 *)((long)&pEVar2->data + lVar5));
      uVar4 = uVar4 + 1;
      pEVar2 = (this->free_list_).
               super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar3 = (this->free_list_).
               super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)((long)pEVar3 - (long)pEVar2 >> 4));
  }
  if (pEVar3 != pEVar2) {
    (this->free_list_).
    super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar2;
  }
  return;
}

Assistant:

void Release(TVMContext ctx, DeviceAPI *device) {
    CHECK_EQ(allocated_.size(), 1);
    for (size_t i = 1; i < free_list_.size(); ++i) {
      device->FreeDataSpace(ctx, free_list_[i].data);
    }
    free_list_.clear();
  }